

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall
tchecker::tck_simulate::edge_lexical_less_t::operator()
          (edge_lexical_less_t *this,edge_sptr_t *e1,edge_sptr_t *e2)

{
  vedge_t *vedge1;
  vedge_t *vedge2;
  int iVar1;
  
  if (e1->_t != (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>
                 *)0x0) {
    vedge1 = &((e1->_t->super_edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>
               ).super_edge_t.super_edge_vedge_t._vedge._t)->super_vedge_t;
    if (vedge1 != (vedge_t *)0x0) {
      if (e2->_t == (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>
                     *)0x0) goto LAB_0012084d;
      vedge2 = &((e2->_t->
                 super_edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>).
                 super_edge_t.super_edge_vedge_t._vedge._t)->super_vedge_t;
      if (vedge2 != (vedge_t *)0x0) {
        iVar1 = tchecker::lexical_cmp(vedge1,vedge2);
        return SUB41((uint)iVar1 >> 0x1f,0);
      }
    }
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1d0,
                  "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::vedge_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::vedge_t>]"
                 );
  }
LAB_0012084d:
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t, tchecker::tck_simulate::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t, tchecker::tck_simulate::edge_t>>]"
               );
}

Assistant:

bool operator()(tchecker::tck_simulate::graph_t::edge_sptr_t const & e1,
                  tchecker::tck_simulate::graph_t::edge_sptr_t const & e2) const
  {
    return tchecker::lexical_cmp(e1->vedge(), e2->vedge()) < 0;
  }